

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_grow(mbedtls_mpi *X,size_t nblimbs)

{
  mbedtls_mpi_uint *__dest;
  mbedtls_mpi_uint *p;
  size_t nblimbs_local;
  mbedtls_mpi *X_local;
  
  if (nblimbs < 0x2711) {
    if (X->n < nblimbs) {
      __dest = (mbedtls_mpi_uint *)calloc(nblimbs,8);
      if (__dest == (mbedtls_mpi_uint *)0x0) {
        return -0x10;
      }
      if (X->p != (mbedtls_mpi_uint *)0x0) {
        memcpy(__dest,X->p,X->n << 3);
        mbedtls_zeroize(X->p,X->n << 3);
        free(X->p);
      }
      X->n = nblimbs;
      X->p = __dest;
    }
    X_local._4_4_ = 0;
  }
  else {
    X_local._4_4_ = -0x10;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_grow( mbedtls_mpi *X, size_t nblimbs )
{
    mbedtls_mpi_uint *p;

    if( nblimbs > MBEDTLS_MPI_MAX_LIMBS )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    if( X->n < nblimbs )
    {
        if( ( p = mbedtls_calloc( nblimbs, ciL ) ) == NULL )
            return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

        if( X->p != NULL )
        {
            memcpy( p, X->p, X->n * ciL );
            mbedtls_zeroize( X->p, X->n * ciL );
            mbedtls_free( X->p );
        }

        X->n = nblimbs;
        X->p = p;
    }

    return( 0 );
}